

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assimp.cpp
# Opt level: O2

aiBool aiIsExtensionSupported(char *szExtension)

{
  bool bVar1;
  Importer tmp;
  allocator<char> local_31;
  Importer local_30;
  char *local_28 [4];
  
  if (szExtension != (char *)0x0) {
    Assimp::Importer::Importer(&local_30);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_28,szExtension,&local_31);
    bVar1 = Assimp::Importer::IsExtensionSupported(&local_30,local_28[0]);
    std::__cxx11::string::~string((string *)local_28);
    Assimp::Importer::~Importer(&local_30);
    return (uint)bVar1;
  }
  __assert_fail("__null != szExtension",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/Assimp.cpp"
                ,0x1dc,"aiBool aiIsExtensionSupported(const char *)");
}

Assistant:

aiBool aiIsExtensionSupported(const char* szExtension)
{
    ai_assert(NULL != szExtension);
    aiBool candoit=AI_FALSE;
    ASSIMP_BEGIN_EXCEPTION_REGION();

    // FIXME: no need to create a temporary Importer instance just for that ..
    Assimp::Importer tmp;
    candoit = tmp.IsExtensionSupported(std::string(szExtension)) ? AI_TRUE : AI_FALSE;

    ASSIMP_END_EXCEPTION_REGION(aiBool);
    return candoit;
}